

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O2

void duckdb::ParquetWriteCombine
               (ExecutionContext *context,FunctionData *bind_data_p,GlobalFunctionData *gstate,
               LocalFunctionData *lstate)

{
  __uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  *this;
  _Head_base<0UL,_duckdb::ColumnDataCollection_*,_false> __p;
  ulong uVar1;
  pointer pCVar2;
  pointer pPVar3;
  type buffer;
  type owned_combine_buffer;
  unique_lock<std::mutex> guard;
  _Head_base<0UL,_duckdb::ColumnDataCollection_*,_false> local_48;
  unique_lock<std::mutex> local_40;
  
  if (lstate[6]._vptr_LocalFunctionData < (_func_int **)(*(ulong *)(bind_data_p + 0x70) >> 1)) {
    uVar1 = duckdb::ColumnDataCollection::SizeInBytes();
    if (uVar1 < *(ulong *)(bind_data_p + 0x78) >> 1) {
      std::unique_lock<std::mutex>::unique_lock(&local_40,(mutex_type *)(gstate + 2));
      this = (__uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
              *)(gstate + 7);
      if (gstate[7]._vptr_GlobalFunctionData == (_func_int **)0x0) {
        make_uniq<duckdb::ColumnDataCollection,duckdb::ClientContext&,duckdb::vector<duckdb::LogicalType,true>&>
                  ((duckdb *)&local_48,*(ClientContext **)context,
                   (vector<duckdb::LogicalType,_true> *)(lstate + 3));
        __p._M_head_impl = local_48._M_head_impl;
        local_48._M_head_impl = (ColumnDataCollection *)0x0;
        std::
        __uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
        ::reset(this,__p._M_head_impl);
        std::
        unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
        ::~unique_ptr((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
                       *)&local_48);
        pCVar2 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                 ::operator->((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                               *)this);
        duckdb::ColumnDataCollection::Combine(pCVar2);
      }
      else {
        pCVar2 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                 ::operator->((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                               *)this);
        duckdb::ColumnDataCollection::Combine(pCVar2);
        pCVar2 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                 ::operator->((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                               *)this);
        if (*(ulong *)(pCVar2 + 0x28) < *(ulong *)(bind_data_p + 0x70) >> 1) {
          unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
          ::operator->((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                        *)this);
          uVar1 = duckdb::ColumnDataCollection::SizeInBytes();
          if (uVar1 < *(ulong *)(bind_data_p + 0x78) >> 1) goto LAB_002cc834;
        }
        local_48._M_head_impl =
             (this->_M_t).
             super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
             .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl;
        (this->_M_t).
        super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
        .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl =
             (ColumnDataCollection *)0x0;
        std::unique_lock<std::mutex>::unlock(&local_40);
        pPVar3 = unique_ptr<duckdb::ParquetWriter,_std::default_delete<duckdb::ParquetWriter>,_true>
                 ::operator->((unique_ptr<duckdb::ParquetWriter,_std::default_delete<duckdb::ParquetWriter>,_true>
                               *)(gstate + 1));
        buffer = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                 ::operator*((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                              *)&local_48);
        ParquetWriter::Flush(pPVar3,buffer);
        std::
        unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
        ::~unique_ptr((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
                       *)&local_48);
      }
LAB_002cc834:
      std::unique_lock<std::mutex>::~unique_lock(&local_40);
      return;
    }
  }
  pPVar3 = unique_ptr<duckdb::ParquetWriter,_std::default_delete<duckdb::ParquetWriter>,_true>::
           operator->((unique_ptr<duckdb::ParquetWriter,_std::default_delete<duckdb::ParquetWriter>,_true>
                       *)(gstate + 1));
  ParquetWriter::Flush(pPVar3,(ColumnDataCollection *)(lstate + 1));
  return;
}

Assistant:

void ParquetWriteCombine(ExecutionContext &context, FunctionData &bind_data_p, GlobalFunctionData &gstate,
                         LocalFunctionData &lstate) {
	auto &bind_data = bind_data_p.Cast<ParquetWriteBindData>();
	auto &global_state = gstate.Cast<ParquetWriteGlobalState>();
	auto &local_state = lstate.Cast<ParquetWriteLocalState>();

	if (local_state.buffer.Count() >= bind_data.row_group_size / 2 ||
	    local_state.buffer.SizeInBytes() >= bind_data.row_group_size_bytes / 2) {
		// local state buffer is more than half of the row_group_size(_bytes), just flush it
		global_state.writer->Flush(local_state.buffer);
		return;
	}

	unique_lock<mutex> guard(global_state.lock);
	if (global_state.combine_buffer) {
		// There is still some data, combine it
		global_state.combine_buffer->Combine(local_state.buffer);
		if (global_state.combine_buffer->Count() >= bind_data.row_group_size / 2 ||
		    global_state.combine_buffer->SizeInBytes() >= bind_data.row_group_size_bytes / 2) {
			// After combining, the combine buffer is more than half of the row_group_size(_bytes), so we flush
			auto owned_combine_buffer = std::move(global_state.combine_buffer);
			guard.unlock();
			// Lock free, of course
			global_state.writer->Flush(*owned_combine_buffer);
		}
		return;
	}

	global_state.combine_buffer = make_uniq<ColumnDataCollection>(context.client, local_state.buffer.Types());
	global_state.combine_buffer->Combine(local_state.buffer);
}